

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O1

void __thiscall
OpenMD::HydroProp::pitchAxes
          (HydroProp *this,Mat3x3d *pitchAxes,Vector3d *pitches,RealType *pitchScalar)

{
  double dVar1;
  int i;
  long lVar2;
  double dVar3;
  RealType RVar4;
  Mat3x3d P;
  Mat3x3d MStack_68;
  
  getPitchMatrix(&MStack_68,this);
  SquareMatrix3<double>::diagonalize(&MStack_68,pitches,pitchAxes);
  *pitchScalar = 0.0;
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar1 = (pitches->super_Vector<double,_3U>).data_[lVar2];
    dVar3 = dVar3 + dVar1 * dVar1;
    *pitchScalar = dVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dVar3 = *pitchScalar / 3.0;
  if (dVar3 < 0.0) {
    RVar4 = sqrt(dVar3);
  }
  else {
    RVar4 = SQRT(dVar3);
  }
  *pitchScalar = RVar4;
  return;
}

Assistant:

void HydroProp::pitchAxes(Mat3x3d& pitchAxes, Vector3d& pitches,
                            RealType& pitchScalar) {
    Mat3x3d P = getPitchMatrix();

    Mat3x3d::diagonalize(P, pitches, pitchAxes);

    pitchScalar = 0.0;
    for (int i = 0; i < 3; i++) {
      pitchScalar += pow(pitches[i], 2);
    }
    pitchScalar /= 3.0;

    pitchScalar = sqrt(pitchScalar);
  }